

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyInsertNodeAtStart(Node *element,Node *node)

{
  Node *node_local;
  Node *element_local;
  
  node->parent = element;
  if (element->content == (Node *)0x0) {
    element->last = node;
  }
  else {
    element->content->prev = node;
  }
  node->next = element->content;
  node->prev = (Node *)0x0;
  element->content = node;
  return;
}

Assistant:

void TY_(InsertNodeAtStart)(Node *element, Node *node)
{
    node->parent = element;

    if (element->content == NULL)
        element->last = node;
    else
        element->content->prev = node;

    node->next = element->content;
    node->prev = NULL;
    element->content = node;
}